

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O3

bool __thiscall
Assimp::ColladaLoader::CanRead(ColladaLoader *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  int iVar2;
  ZipArchiveIOSystem *zip_archive_00;
  string extension;
  ZipArchiveIOSystem zip_archive;
  string local_88;
  undefined1 local_68 [40];
  string local_40;
  
  BaseImporter::GetExtension(&local_88,pFile);
  if (pIOHandler == (IOSystem *)0x0 || !checkSig) {
    iVar2 = std::__cxx11::string::compare((char *)&local_88);
    bVar1 = true;
    if ((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)&local_88), iVar2 == 0))
    goto LAB_00412bb6;
  }
  else {
    ZipArchiveIOSystem::ZipArchiveIOSystem((ZipArchiveIOSystem *)local_68,pIOHandler,pFile,"r");
    bVar1 = ZipArchiveIOSystem::isOpen((ZipArchiveIOSystem *)local_68);
    if (bVar1) {
      ColladaParser::ReadZaeManifest_abi_cxx11_(&local_40,(ColladaParser *)local_68,zip_archive_00);
      bVar1 = local_40._M_string_length != 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      ZipArchiveIOSystem::~ZipArchiveIOSystem((ZipArchiveIOSystem *)local_68);
      goto LAB_00412bb6;
    }
    ZipArchiveIOSystem::~ZipArchiveIOSystem((ZipArchiveIOSystem *)local_68);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_88);
  if (iVar2 == 0) {
    if (pIOHandler == (IOSystem *)0x0) {
      bVar1 = true;
      goto LAB_00412bb6;
    }
  }
  else {
    bVar1 = local_88._M_string_length == 0 || checkSig;
    if (pIOHandler == (IOSystem *)0x0 || local_88._M_string_length != 0 && !checkSig)
    goto LAB_00412bb6;
  }
  bVar1 = BaseImporter::SearchFileHeaderForToken(pIOHandler,pFile,CanRead::tokens,1,200,false,false)
  ;
LAB_00412bb6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool ColladaLoader::CanRead(const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const {
    // check file extension
    const std::string extension = GetExtension(pFile);

    bool readSig = checkSig && (pIOHandler != nullptr);

    if (!readSig) {
        if (extension == "dae" || extension == "zae") {
            return true;
        }
    }

    if (readSig) {
        // Look for a DAE file inside, but don't extract it
        ZipArchiveIOSystem zip_archive(pIOHandler, pFile);
        if (zip_archive.isOpen())
            return !ColladaParser::ReadZaeManifest(zip_archive).empty();
    }

    // XML - too generic, we need to open the file and search for typical keywords
    if (extension == "xml" || !extension.length() || checkSig) {
        /*  If CanRead() is called in order to check whether we
         *  support a specific file extension in general pIOHandler
         *  might be NULL and it's our duty to return true here.
         */
        if (!pIOHandler) {
            return true;
        }
        static const char* tokens[] = { "<collada" };
        return SearchFileHeaderForToken(pIOHandler, pFile, tokens, 1);
    }

    return false;
}